

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

void __thiscall
cmQtAutoGenInitializer::cmQtAutoGenInitializer
          (cmQtAutoGenInitializer *this,cmQtAutoGenGlobalInitializer *globalInitializer,
          cmGeneratorTarget *genTarget,IntegerVersion *qtVersion,bool mocEnabled,bool uicEnabled,
          bool rccEnabled,bool globalAutogenTarget,bool globalAutoRccTarget)

{
  cmGlobalGenerator *pcVar1;
  cmLocalGenerator *pcVar2;
  bool globalAutoRccTarget_local;
  bool globalAutogenTarget_local;
  bool rccEnabled_local;
  bool uicEnabled_local;
  bool mocEnabled_local;
  IntegerVersion *qtVersion_local;
  cmGeneratorTarget *genTarget_local;
  cmQtAutoGenGlobalInitializer *globalInitializer_local;
  cmQtAutoGenInitializer *this_local;
  
  this->GlobalInitializer = globalInitializer;
  this->GenTarget = genTarget;
  pcVar1 = cmGeneratorTarget::GetGlobalGenerator(genTarget);
  this->GlobalGen = pcVar1;
  pcVar2 = cmGeneratorTarget::GetLocalGenerator(genTarget);
  this->LocalGen = pcVar2;
  this->Makefile = genTarget->Makefile;
  cmFilePathChecksum::cmFilePathChecksum(&this->PathCheckSum,genTarget->Makefile);
  this->QtVersion = *qtVersion;
  this->Verbosity = 0;
  this->MultiConfig = false;
  this->CMP0071Accept = false;
  this->CMP0071Warn = false;
  this->CMP0100Accept = false;
  this->CMP0100Warn = false;
  std::__cxx11::string::string((string *)&this->ConfigDefault);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->ConfigsList);
  std::__cxx11::string::string((string *)&this->TargetsFolder);
  {unnamed_type#1}::cmQtAutoGenInitializer((_unnamed_type_1_ *)&this->Dir);
  {unnamed_type#2}::cmQtAutoGenInitializer((_unnamed_type_2_ *)&this->AutogenTarget);
  MocT::MocT(&this->Moc);
  UicT::UicT(&this->Uic);
  RccT::RccT(&this->Rcc);
  (this->AutogenTarget).GlobalTarget = globalAutogenTarget;
  (this->Moc).super_GenVarsT.Enabled = mocEnabled;
  (this->Uic).super_GenVarsT.Enabled = uicEnabled;
  (this->Rcc).super_GenVarsT.Enabled = rccEnabled;
  (this->Rcc).GlobalTarget = globalAutoRccTarget;
  return;
}

Assistant:

cmQtAutoGenInitializer::cmQtAutoGenInitializer(
  cmQtAutoGenGlobalInitializer* globalInitializer,
  cmGeneratorTarget* genTarget, IntegerVersion const& qtVersion,
  bool mocEnabled, bool uicEnabled, bool rccEnabled, bool globalAutogenTarget,
  bool globalAutoRccTarget)
  : GlobalInitializer(globalInitializer)
  , GenTarget(genTarget)
  , GlobalGen(genTarget->GetGlobalGenerator())
  , LocalGen(genTarget->GetLocalGenerator())
  , Makefile(genTarget->Makefile)
  , PathCheckSum(genTarget->Makefile)
  , QtVersion(qtVersion)
{
  this->AutogenTarget.GlobalTarget = globalAutogenTarget;
  this->Moc.Enabled = mocEnabled;
  this->Uic.Enabled = uicEnabled;
  this->Rcc.Enabled = rccEnabled;
  this->Rcc.GlobalTarget = globalAutoRccTarget;
}